

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O3

bool spvtools::opt::anon_unknown_15::IsInCorrectFormForGCDTest(SENode *node)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  byte bVar5;
  undefined8 *puVar6;
  bool bVar7;
  long lVar4;
  
  iVar3 = (*node->_vptr_SENode[8])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  bVar7 = true;
  bVar5 = 1;
  if (lVar4 != 0) {
    puVar1 = *(undefined8 **)(lVar4 + 0x10);
    for (puVar6 = *(undefined8 **)(lVar4 + 8); puVar6 != puVar1; puVar6 = puVar6 + 1) {
      bVar2 = IsInCorrectFormForGCDTest((SENode *)*puVar6);
      bVar5 = bVar5 & bVar2;
    }
  }
  iVar3 = (*node->_vptr_SENode[6])(node);
  if (CONCAT44(extraout_var_00,iVar3) == 0) {
    iVar3 = (*node->_vptr_SENode[8])(node);
    if (CONCAT44(extraout_var_01,iVar3) == 0) {
      iVar3 = (*node->_vptr_SENode[4])(node);
      bVar7 = CONCAT44(extraout_var_02,iVar3) != 0;
    }
  }
  return (bool)(bVar5 & bVar7);
}

Assistant:

bool IsInCorrectFormForGCDTest(SENode* node) {
  bool children_ok = true;

  if (auto add_node = node->AsSEAddNode()) {
    for (auto child : add_node->GetChildren()) {
      children_ok &= IsInCorrectFormForGCDTest(child);
    }
  }

  bool this_ok = node->AsSERecurrentNode() || node->AsSEAddNode() ||
                 node->AsSEConstantNode();

  return children_ok && this_ok;
}